

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

pair<const_llvm::LoadInst_*,_const_llvm::Value_*>
dg::vr::getParams(ValueRelations *graph,ICmpInst *icmp)

{
  V v;
  LoadInst *pLVar1;
  V v_00;
  pair<const_llvm::LoadInst_*,_const_llvm::Value_*> pVar2;
  
  v = *(V *)(icmp + -0x40);
  v_00 = *(V *)(icmp + -0x20);
  pLVar1 = ValueRelations::getInstance<llvm::LoadInst>(graph,v);
  if ((pLVar1 == (LoadInst *)0x0) &&
     (pLVar1 = ValueRelations::getInstance<llvm::LoadInst>(graph,v_00), v_00 = v,
     pLVar1 == (LoadInst *)0x0)) {
    v_00 = (V)0x0;
  }
  pVar2.second = v_00;
  pVar2.first = pLVar1;
  return pVar2;
}

Assistant:

std::pair<const llvm::LoadInst *, const llvm::Value *>
getParams(const ValueRelations &graph, const llvm::ICmpInst *icmp) {
    const llvm::Value *op1 = icmp->getOperand(0);
    const llvm::Value *op2 = icmp->getOperand(1);
    if (const auto *load = graph.getInstance<llvm::LoadInst>(op1))
        return {load, op2};
    if (const auto *load = graph.getInstance<llvm::LoadInst>(op2))
        return {load, op1};
    return {nullptr, nullptr};
}